

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

_Bool Is_There_Room_For_A_Line(FORM *form)

{
  int iVar1;
  int blen;
  FIELD *pFVar2;
  char *pcVar3;
  char *pcVar4;
  
  pFVar2 = form->current;
  Synchronize_Buffer(form);
  iVar1 = pFVar2->drows;
  blen = pFVar2->dcols;
  pcVar3 = pFVar2->buf;
  pcVar4 = After_End_Of_Data(pcVar3 + ((long)iVar1 + -1) * (long)blen,blen);
  return pcVar4 == pcVar3 + ((long)iVar1 + -1) * (long)blen;
}

Assistant:

INLINE static bool Is_There_Room_For_A_Line(FORM * form)
{
  FIELD *field = form->current;
  char *begin_of_last_line, *s;
  
  Synchronize_Buffer(form);
  begin_of_last_line = Address_Of_Row_In_Buffer(field,(field->drows-1));
  s  = After_End_Of_Data(begin_of_last_line,field->dcols);
  return ((s==begin_of_last_line) ? TRUE : FALSE);
}